

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O3

Statement *
slang::ast::BreakStatement::fromSyntax
          (Compilation *compilation,JumpStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  Statement *stmt;
  SourceRange sourceRange;
  SourceRange local_38;
  
  local_38 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  stmt = &BumpAllocator::emplace<slang::ast::BreakStatement,slang::SourceRange>
                    (&compilation->super_BumpAllocator,&local_38)->super_Statement;
  if (((stmtCtx->flags).m_bits & 5) == 0) {
    sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    ASTContext::addDiag(context,(DiagCode)0x470008,sourceRange);
    stmt = Statement::badStmt(compilation,stmt);
  }
  return stmt;
}

Assistant:

Statement& BreakStatement::fromSyntax(Compilation& compilation, const JumpStatementSyntax& syntax,
                                      const ASTContext& context, StatementContext& stmtCtx) {
    auto result = compilation.emplace<BreakStatement>(syntax.sourceRange());
    if (!stmtCtx.flags.has(StatementFlags::InLoop | StatementFlags::InRandSeq)) {
        context.addDiag(diag::StatementNotInLoop, syntax.sourceRange());
        return badStmt(compilation, result);
    }
    return *result;
}